

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferTestUtil.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::BufferTestUtil::BufferVerifierBase::BufferVerifierBase
          (BufferVerifierBase *this,Context *context)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *log;
  Context *context_local;
  BufferVerifierBase *this_local;
  
  pRVar2 = gles2::Context::getRenderContext(context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  this_00 = gles2::Context::getTestContext(context);
  log = tcu::TestContext::getLog(this_00);
  glu::CallLogWrapper::CallLogWrapper
            (&this->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var,iVar1),log);
  this->_vptr_BufferVerifierBase = (_func_int **)&PTR__BufferVerifierBase_03282678;
  this->m_context = context;
  glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
  return;
}

Assistant:

BufferVerifierBase::BufferVerifierBase (Context& context)
	: CallLogWrapper	(context.getRenderContext().getFunctions(), context.getTestContext().getLog())
	, m_context			(context)
{
	enableLogging(LOG_VERIFIER_CALLS);
}